

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O1

int X509_REQ_get_attr_by_OBJ(X509_REQ *req,ASN1_OBJECT *obj,int lastpos)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  ulong i;
  
  sk = (OPENSSL_STACK *)req->req_info->attributes;
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_001af563:
    iVar4 = -1;
  }
  else {
    sVar2 = OPENSSL_sk_num(sk);
    if (lastpos < 0) {
      lastpos = 0xffffffff;
    }
    uVar5 = (ulong)(uint)lastpos;
    i = (ulong)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar2 <= (long)i) goto LAB_001af563;
      puVar3 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)req->req_info->attributes,i);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)*puVar3,obj);
      if (iVar1 == 0) {
        uVar5 = i & 0xffffffff;
      }
      iVar4 = (int)uVar5;
    } while (iVar1 != 0);
  }
  return iVar4;
}

Assistant:

int X509_REQ_get_attr_by_OBJ(const X509_REQ *req, const ASN1_OBJECT *obj,
                             int lastpos) {
  if (req->req_info->attributes == NULL) {
    return -1;
  }
  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }
  int n = (int)sk_X509_ATTRIBUTE_num(req->req_info->attributes);
  for (; lastpos < n; lastpos++) {
    const X509_ATTRIBUTE *attr =
        sk_X509_ATTRIBUTE_value(req->req_info->attributes, lastpos);
    if (OBJ_cmp(attr->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}